

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crnlib.cpp
# Opt level: O3

void * crn_decompress_crn_to_dds(void *pCRN_file_data,crn_uint32 *file_size)

{
  bool bVar1;
  byte bVar2;
  uchar *puVar3;
  crn_uint32 cVar4;
  dynamic_stream dds_file_data;
  data_stream_serializer serializer;
  mipmapped_texture tex;
  dynamic_stream local_b0;
  data_stream_serializer local_78;
  mipmapped_texture local_68;
  
  crnlib::mipmapped_texture::mipmapped_texture(&local_68);
  bVar1 = crnlib::mipmapped_texture::read_crn_from_memory
                    (&local_68,pCRN_file_data,*file_size,"from_memory.crn");
  *file_size = 0;
  if (bVar1) {
    crnlib::dynamic_stream::dynamic_stream(&local_b0);
    if ((local_b0.super_data_stream._26_1_ & 1) != 0) {
      crnlib::vector<unsigned_char>::reserve(&local_b0.m_buf,0x20000);
    }
    local_78.m_little_endian = true;
    local_78.m_pStream = &local_b0.super_data_stream;
    bVar1 = crnlib::mipmapped_texture::write_dds(&local_68,&local_78);
    if (bVar1) {
      bVar2 = 0;
      if ((local_b0.super_data_stream._26_1_ & 1) != 0) {
        crnlib::vector<unsigned_char>::reserve(&local_b0.m_buf,0);
        bVar2 = local_b0.super_data_stream._26_1_;
      }
      puVar3 = local_b0.m_buf.m_p;
      cVar4 = 0;
      if ((bVar2 & 1) != 0) {
        cVar4 = local_b0.m_buf.m_size;
      }
      *file_size = cVar4;
      local_b0.m_buf.m_p = (uchar *)0x0;
      local_b0.m_buf.m_size = 0;
      local_b0.m_buf.m_capacity = 0;
    }
    else {
      puVar3 = (uchar *)0x0;
    }
    crnlib::dynamic_stream::~dynamic_stream(&local_b0);
  }
  else {
    puVar3 = (uchar *)0x0;
  }
  crnlib::mipmapped_texture::~mipmapped_texture(&local_68);
  return puVar3;
}

Assistant:

void* crn_decompress_crn_to_dds(const void* pCRN_file_data, crn_uint32& file_size) {
  mipmapped_texture tex;
  if (!tex.read_crn_from_memory(pCRN_file_data, file_size, "from_memory.crn")) {
    file_size = 0;
    return NULL;
  }

  file_size = 0;

  dynamic_stream dds_file_data;
  dds_file_data.reserve(128 * 1024);
  data_stream_serializer serializer(dds_file_data);
  if (!tex.write_dds(serializer))
    return NULL;
  dds_file_data.reserve(0);

  file_size = static_cast<crn_uint32>(dds_file_data.get_size());
  return dds_file_data.get_buf().assume_ownership();
}